

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FStatistics,_FStatistics>::DoDelete
          (TArray<FStatistics,_FStatistics> *this,uint first,uint last)

{
  FStatistics *pFVar1;
  int iVar2;
  long lVar3;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar3 = (ulong)first << 5;
      iVar2 = (last - first) + 1;
      do {
        pFVar1 = this->Array;
        FString::~FString((FString *)((long)&(pFVar1->epi_header).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->epi_name).Chars + lVar3));
        TArray<FSessionStatistics,_FSessionStatistics>::~TArray
                  ((TArray<FSessionStatistics,_FSessionStatistics> *)
                   ((long)&(pFVar1->stats).Array + lVar3));
        lVar3 = lVar3 + 0x20;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                ,0x1b2,
                "void TArray<FStatistics>::DoDelete(unsigned int, unsigned int) [T = FStatistics, TT = FStatistics]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}